

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O3

size_t __thiscall
brotli::HashToBinaryTree::FindAllMatches
          (HashToBinaryTree *this,uint8_t *data,size_t ring_buffer_mask,size_t cur_ix,
          size_t max_length,size_t max_backward,BackwardMatch *matches)

{
  uint8_t *puVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bool bVar5;
  uint32_t *matches_00;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  BackwardMatch BVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  uint8_t *puVar16;
  ulong uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  BackwardMatch *local_78;
  size_t best_len;
  size_t local_68;
  uint8_t *local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  HashToBinaryTree *local_40;
  ulong local_38;
  
  local_38 = cur_ix & ring_buffer_mask;
  best_len = 1;
  uVar7 = 0;
  if (0x3f < cur_ix) {
    uVar7 = cur_ix - 0x40;
  }
  uVar13 = cur_ix - 1;
  if (uVar7 < uVar13) {
    puVar1 = data + local_38;
    local_50 = max_length >> 3;
    local_58 = max_length & 0xfffffffffffffff8;
    local_60 = puVar1 + local_58;
    local_48 = (ulong)((uint)max_length & 7);
    uVar6 = 1;
    local_78 = matches;
    while (cur_ix - uVar13 <= max_backward) {
      uVar9 = uVar13 & ring_buffer_mask;
      if ((*puVar1 == data[uVar9]) && (puVar1[1] == data[uVar9 + 1])) {
        if (7 < max_length) {
          lVar15 = 0;
          uVar10 = 0;
LAB_001200df:
          if (*(ulong *)(puVar1 + uVar10 * 8) == *(ulong *)(data + uVar10 * 8 + uVar9))
          goto code_r0x001200ec;
          uVar10 = *(ulong *)(data + uVar10 * 8 + uVar9) ^ *(ulong *)(puVar1 + uVar10 * 8);
          uVar9 = 0;
          if (uVar10 != 0) {
            for (; (uVar10 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
            }
          }
          uVar10 = (uVar9 >> 3 & 0x1fffffff) - lVar15;
          goto LAB_00120120;
        }
        uVar14 = 0;
        puVar16 = puVar1;
LAB_00120163:
        uVar10 = uVar14;
        if (local_48 != 0) {
          uVar17 = uVar14 | local_48;
          uVar11 = local_48;
          do {
            uVar10 = uVar14;
            local_68 = max_backward;
            if (data[uVar14 + uVar9] != *puVar16) break;
            puVar16 = puVar16 + 1;
            uVar14 = uVar14 + 1;
            uVar11 = uVar11 - 1;
            uVar10 = uVar17;
          } while (uVar11 != 0);
        }
LAB_00120120:
        if (uVar6 < uVar10) {
          *local_78 = (BackwardMatch)(cur_ix - uVar13 & 0xffffffff | uVar10 << 0x25);
          local_78 = local_78 + 1;
          uVar6 = uVar10;
          best_len = uVar10;
        }
      }
      uVar13 = uVar13 - 1;
      if ((uVar13 <= uVar7) || (2 < uVar6)) break;
    }
  }
  else {
    uVar6 = 1;
    local_78 = matches;
  }
  local_40 = this;
  if (uVar6 < max_length) {
    local_78 = StoreAndFindMatches(this,data,cur_ix,ring_buffer_mask,max_length,&best_len,local_78);
  }
  matches_00 = (uint32_t *)operator_new(0x98);
  auVar4 = _DAT_001b78d0;
  auVar3 = _DAT_001b78c0;
  auVar2 = _DAT_001b6f00;
  lVar15 = 0;
  do {
    auVar18._8_4_ = (int)lVar15;
    auVar18._0_8_ = lVar15;
    auVar18._12_4_ = (int)((ulong)lVar15 >> 0x20);
    auVar19 = (auVar18 | auVar2) ^ auVar4;
    if (auVar19._4_4_ == -0x80000000 && auVar19._0_4_ < -0x7fffffda) {
      matches_00[lVar15] = 0xfffffff;
      matches_00[lVar15 + 1] = 0xfffffff;
    }
    auVar18 = (auVar18 | auVar3) ^ auVar4;
    if (auVar18._4_4_ == -0x80000000 && auVar18._0_4_ < -0x7fffffda) {
      matches_00[lVar15 + 2] = 0xfffffff;
      matches_00[lVar15 + 3] = 0xfffffff;
    }
    lVar15 = lVar15 + 4;
  } while (lVar15 != 0x28);
  uVar7 = 4;
  if (4 < best_len + 1) {
    uVar7 = best_len + 1;
  }
  bVar5 = FindAllStaticDictionaryMatches(data + local_38,uVar7,max_length,matches_00);
  if (bVar5) {
    uVar13 = 0x25;
    if (max_length < 0x25) {
      uVar13 = max_length;
    }
    if (uVar7 <= uVar13) {
      lVar15 = uVar7 << 5;
      do {
        uVar8 = matches_00[uVar7];
        if (uVar8 < 0xfffffff) {
          BVar12.distance = (uVar8 >> 5) + (int)max_backward + 1;
          uVar8 = uVar8 & 0x1f;
          if (uVar7 == uVar8) {
            uVar8 = 0;
          }
          BVar12.length_and_code = uVar8 | (uint)lVar15;
          *local_78 = BVar12;
          local_78 = local_78 + 1;
        }
        uVar7 = uVar7 + 1;
        lVar15 = lVar15 + 0x20;
      } while (uVar13 + 1 != uVar7);
    }
  }
  operator_delete(matches_00,0x98);
  return (long)local_78 - (long)matches >> 3;
code_r0x001200ec:
  uVar10 = uVar10 + 1;
  lVar15 = lVar15 + -8;
  uVar14 = local_58;
  puVar16 = local_60;
  if (local_50 == uVar10) goto LAB_00120163;
  goto LAB_001200df;
}

Assistant:

size_t FindAllMatches(const uint8_t* data,
                        const size_t ring_buffer_mask,
                        const size_t cur_ix,
                        const size_t max_length,
                        const size_t max_backward,
                        BackwardMatch* matches) {
    BackwardMatch* const orig_matches = matches;
    const size_t cur_ix_masked = cur_ix & ring_buffer_mask;
    size_t best_len = 1;
    size_t stop = cur_ix - 64;
    if (cur_ix < 64) { stop = 0; }
    for (size_t i = cur_ix - 1; i > stop && best_len <= 2; --i) {
      size_t prev_ix = i;
      const size_t backward = cur_ix - prev_ix;
      if (PREDICT_FALSE(backward > max_backward)) {
        break;
      }
      prev_ix &= ring_buffer_mask;
      if (data[cur_ix_masked] != data[prev_ix] ||
          data[cur_ix_masked + 1] != data[prev_ix + 1]) {
        continue;
      }
      const size_t len =
          FindMatchLengthWithLimit(&data[prev_ix], &data[cur_ix_masked],
                                   max_length);
      if (len > best_len) {
        best_len = len;
        *matches++ = BackwardMatch(backward, len);
      }
    }
    if (best_len < max_length) {
      matches = StoreAndFindMatches(data, cur_ix, ring_buffer_mask,
                                    max_length, &best_len, matches);
    }
    std::vector<uint32_t> dict_matches(kMaxDictionaryMatchLen + 1,
                                       kInvalidMatch);
    size_t minlen = std::max<size_t>(4, best_len + 1);
    if (FindAllStaticDictionaryMatches(&data[cur_ix_masked], minlen, max_length,
                                       &dict_matches[0])) {
      size_t maxlen = std::min<size_t>(kMaxDictionaryMatchLen, max_length);
      for (size_t l = minlen; l <= maxlen; ++l) {
        uint32_t dict_id = dict_matches[l];
        if (dict_id < kInvalidMatch) {
          *matches++ = BackwardMatch(max_backward + (dict_id >> 5) + 1, l,
                                     dict_id & 31);
        }
      }
    }
    return static_cast<size_t>(matches - orig_matches);
  }